

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void __thiscall
Omega_h::Read<signed_char>::Read
          (Read<signed_char> *this,initializer_list<signed_char> l,string *name_in)

{
  void *__buf;
  Write<signed_char> local_30;
  Write<signed_char> local_20;
  
  HostWrite<signed_char>::HostWrite((HostWrite<signed_char> *)&local_20,l,name_in);
  HostWrite<signed_char>::write
            ((HostWrite<signed_char> *)&local_30,(int)&local_20,__buf,(size_t)name_in);
  Write<signed_char>::Write(&this->write_,&local_30);
  Write<signed_char>::~Write(&local_30);
  Write<signed_char>::~Write(&local_20);
  return;
}

Assistant:

Read<T>::Read(std::initializer_list<T> l, std::string const& name_in)
    : Read<T>(HostWrite<T>(l, name_in).write()) {}